

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O3

pair<char,_char> computeEntry(char *base1,char *qual1,char *base2,char *qual2)

{
  char cVar1;
  byte bVar2;
  short sVar3;
  long lVar5;
  int iVar4;
  
  bVar2 = *base1;
  lVar5 = (long)*qual1;
  if (bVar2 == *base2) {
    iVar4 = 0x5d;
    if (*(int *)((anonymous_namespace)::error_agreement + (long)*qual2 * 4 + lVar5 * 0x1fc) < 0x5d)
    {
      iVar4 = *(int *)((anonymous_namespace)::error_agreement + (long)*qual2 * 4 + lVar5 * 0x1fc);
    }
    sVar3 = (short)iVar4;
  }
  else {
    cVar1 = *qual2;
    if (*qual1 < cVar1) {
      sVar3 = (short)*(undefined4 *)
                      ((anonymous_namespace)::error_disagreement + lVar5 * 4 + (long)cVar1 * 0x1fc);
      bVar2 = *base2;
    }
    else {
      sVar3 = (short)*(undefined4 *)
                      ((anonymous_namespace)::error_disagreement + (long)cVar1 * 4 + lVar5 * 0x1fc);
    }
  }
  return (pair<char,_char>)((ushort)bVar2 + sVar3 * 0x100 + 0x2100);
}

Assistant:

std::pair<char,char> computeEntry(const char& base1, const char& qual1, const char& base2, const char& qual2){
    std::pair<char,char> result;

    if (base1==base2){
        result.first = base1;
        result.second = std::min(error_agreement[qual1][qual2]+33,126);
    }
    else if (qual1>=qual2) {
        result.first = base1;
        result.second = error_disagreement[qual1][qual2]+33;
    } else {
        result.first = base2;
        result.second = error_disagreement[qual2][qual1]+33;
    }
    return result;
}